

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bp_osd.cpp
# Opt level: O3

char * __thiscall bp_osd::bp_decode(bp_osd *this,char *synd)

{
  ostream *poVar1;
  
  switch(this->bp_method) {
  case 0:
    bp_decode_ms(this->H,synd,this->channel_prob,this->max_iter,this->converge,this->iter,
                 this->bp_decoding,this->log_prob_ratios);
    break;
  case 1:
    bp_decode_ms_min_synd
              (this->H,synd,this->channel_prob,this->max_iter,this->converge,this->iter,
               this->bp_decoding,this->log_prob_ratios);
    break;
  case 2:
    bp_decode_ps(this->H,synd,this->channel_prob,this->max_iter,this->converge,this->iter,
                 this->bp_decoding,this->log_prob_ratios);
    break;
  case 3:
    bp_decode_ps_min_synd
              (this->H,synd,this->channel_prob,this->max_iter,this->converge,this->iter,
               this->bp_decoding,this->log_prob_ratios);
    break;
  default:
    poVar1 = std::operator<<((ostream *)&std::cout,"ERROR in <bp_osd::bp_decode>: Invalid BP_method"
                            );
    std::endl<char,std::char_traits<char>>(poVar1);
    exit(0x16);
  }
  return this->bp_decoding;
}

Assistant:

char *bp_osd::bp_decode(char *synd) {

    if(bp_method==0) bp_decode_ms(H,synd,channel_prob,max_iter,converge,iter,bp_decoding,log_prob_ratios);
    else if(bp_method==1) bp_decode_ms_min_synd(H,synd,channel_prob,max_iter,converge,iter,bp_decoding,log_prob_ratios);
    else if(bp_method==2) bp_decode_ps(H,synd,channel_prob,max_iter,converge,iter,bp_decoding,log_prob_ratios);
    else if(bp_method==3) bp_decode_ps_min_synd(H,synd,channel_prob,max_iter,converge,iter,bp_decoding,log_prob_ratios);
    else{
        cout<<"ERROR in <bp_osd::bp_decode>: Invalid BP_method" <<endl;
        exit(22);
    }





    return bp_decoding;



}